

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOrderAction::~IfcOrderAction(IfcOrderAction *this)

{
  IfcTask *this_00;
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&this->super_IfcTask + -0x18);
  this_00 = (IfcTask *)(&(this->super_IfcTask).field_0x0 + lVar2);
  plVar1 = (long *)(&this->field_0x1b0 + lVar2);
  plVar1[-0x36] = 0x8ba0d0;
  plVar1[2] = 0x8ba1c0;
  plVar1[-0x25] = 0x8ba0f8;
  plVar1[-0x23] = 0x8ba120;
  plVar1[-0x1c] = 0x8ba148;
  plVar1[-0x1a] = 0x8ba170;
  plVar1[-4] = 0x8ba198;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcTask::~IfcTask(this_00,&PTR_construction_vtable_24__008ba1d8);
  operator_delete(this_00,0x1d8);
  return;
}

Assistant:

IfcOrderAction() : Object("IfcOrderAction") {}